

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

void background_thread_postfork_child(tsdn_t *tsdn)

{
  background_thread_info_t *pbVar1;
  uint uVar2;
  background_thread_info_t *info;
  malloc_mutex_t *mutex;
  ulong uVar3;
  background_thread_info_t *tsdn_00;
  
  for (uVar2 = 0; uVar2 < max_background_threads; uVar2 = uVar2 + 1) {
    malloc_mutex_postfork_child(tsdn,&background_thread_info[uVar2].mtx);
  }
  malloc_mutex_postfork_child(tsdn,&background_thread_lock);
  if (background_thread_enabled_at_fork != false) {
    malloc_mutex_lock(tsdn,&background_thread_lock);
    n_background_threads = 0;
    background_thread_enabled_state.repr = false;
    for (uVar2 = 0; pbVar1 = background_thread_info, uVar3 = (ulong)uVar2,
        uVar3 < max_background_threads; uVar2 = uVar2 + 1) {
      tsdn_00 = background_thread_info + uVar3;
      mutex = &background_thread_info[uVar3].mtx;
      malloc_mutex_lock(tsdn,mutex);
      *(background_thread_state_t *)(mutex + 1) = background_thread_stopped;
      info = (background_thread_info_t *)0x0;
      pthread_cond_init((pthread_cond_t *)&pbVar1[uVar3].cond,(pthread_condattr_t *)0x0);
      background_thread_info_init((tsdn_t *)tsdn_00,info);
      (mutex->field_0).field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&pbVar1[uVar3].mtx.field_0 + 0x40));
    }
    background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
    return;
  }
  return;
}

Assistant:

void
background_thread_postfork_child(tsdn_t *tsdn) {
	for (unsigned i = 0; i < max_background_threads; i++) {
		malloc_mutex_postfork_child(tsdn,
		    &background_thread_info[i].mtx);
	}
	malloc_mutex_postfork_child(tsdn, &background_thread_lock);
	if (!background_thread_enabled_at_fork) {
		return;
	}

	/* Clear background_thread state (reset to disabled for child). */
	malloc_mutex_lock(tsdn, &background_thread_lock);
	n_background_threads = 0;
	background_thread_enabled_set(tsdn, false);
	for (unsigned i = 0; i < max_background_threads; i++) {
		background_thread_info_t *info = &background_thread_info[i];
		malloc_mutex_lock(tsdn, &info->mtx);
		info->state = background_thread_stopped;
		int ret = pthread_cond_init(&info->cond, NULL);
		assert(ret == 0);
		background_thread_info_init(tsdn, info);
		malloc_mutex_unlock(tsdn, &info->mtx);
	}
	malloc_mutex_unlock(tsdn, &background_thread_lock);
}